

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall
Am_Object::Set_Type_Check(Am_Object *this,Am_Slot_Key key,unsigned_short type)

{
  Am_Slot local_28;
  Am_Slot_Data *local_20;
  Am_Slot_Data *slot;
  unsigned_short type_local;
  Am_Object *pAStack_10;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  slot._4_2_ = type;
  slot._6_2_ = key;
  pAStack_10 = this;
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("Set_Type_Check called on a (0L) object.");
  }
  local_20 = Am_Object_Data::find_slot(this->data,key);
  if ((local_20 == (Am_Slot_Data *)0x0) || (local_20->context != this->data)) {
    slot_error("Set_Type_Check: slot does not exist or is not local",this,slot._6_2_);
  }
  Am_Slot::Am_Slot(&local_28,local_20);
  Am_Slot::Set_Type_Check(&local_28,slot._4_2_);
  return this;
}

Assistant:

Am_Object &
Am_Object::Set_Type_Check(Am_Slot_Key key, unsigned short type)
{
  if (!data)
    Am_Error("Set_Type_Check called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (!slot || slot->context != data)
    slot_error("Set_Type_Check: slot does not exist or is not local", *this,
               key);
  Am_Slot(slot).Set_Type_Check(type);
  return *this;
}